

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyUtil.c
# Opt level: O2

int Ivy_ManResetLevels_rec(Ivy_Obj_t *pObj)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = *(uint *)&pObj->field_0x8;
  if ((((uVar1 < 0x800) && (uVar2 = uVar1 & 0xf, uVar2 != 1)) && (uVar2 != 4)) && (pObj->Id != 0)) {
    if (uVar2 == 7) {
      uVar1 = Ivy_ManResetLevels_rec((Ivy_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
      uVar2 = uVar1;
    }
    else {
      if (uVar2 - 7 < 0xfffffffe) {
        __assert_fail("Ivy_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyUtil.c"
                      ,0x113,"int Ivy_ManResetLevels_rec(Ivy_Obj_t *)");
      }
      Ivy_ManResetLevels_rec((Ivy_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
      Ivy_ManResetLevels_rec((Ivy_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe));
      uVar2 = Ivy_ObjLevelNew(pObj);
      uVar1 = uVar2 & 0x1fffff;
    }
    *(uint *)&pObj->field_0x8 = *(uint *)&pObj->field_0x8 & 0x7ff | uVar2 << 0xb;
  }
  else {
    uVar1 = uVar1 >> 0xb;
  }
  return uVar1;
}

Assistant:

int Ivy_ManResetLevels_rec( Ivy_Obj_t * pObj )
{
    if ( pObj->Level || Ivy_ObjIsCi(pObj) || Ivy_ObjIsConst1(pObj) )
        return pObj->Level;
    if ( Ivy_ObjIsBuf(pObj) )
        return pObj->Level = Ivy_ManResetLevels_rec( Ivy_ObjFanin0(pObj) );
    assert( Ivy_ObjIsNode(pObj) );
    Ivy_ManResetLevels_rec( Ivy_ObjFanin0(pObj) );
    Ivy_ManResetLevels_rec( Ivy_ObjFanin1(pObj) );
    return pObj->Level = Ivy_ObjLevelNew( pObj );
}